

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

bool __thiscall
pbrt::WeightedReservoirSampler<pbrt::Light>::Add
          (WeightedReservoirSampler<pbrt::Light> *this,Light *sample,Float weight)

{
  Light *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  Float p;
  
  *(float *)&in_RDI[2].
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits =
       in_XMM0_Da +
       *(float *)&in_RDI[2].
                  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  .bits;
  fVar1 = in_XMM0_Da /
          *(float *)&in_RDI[2].
                     super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                     .bits;
  fVar2 = RNG::Uniform<float>((RNG *)CONCAT44(in_XMM0_Da,fVar1));
  if (fVar2 < fVar1) {
    Light::operator=((Light *)CONCAT44(in_XMM0_Da,fVar1),in_RDI);
    *(float *)((long)&in_RDI[2].
                      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      .bits + 4) = in_XMM0_Da;
  }
  return fVar2 < fVar1;
}

Assistant:

PBRT_CPU_GPU
    bool Add(const T &sample, Float weight) {
        weightSum += weight;
        // Randomly add _sample_ to reservoir
        Float p = weight / weightSum;
        if (rng.Uniform<Float>() < p) {
            reservoir = sample;
            reservoirWeight = weight;
            return true;
        }
        DCHECK_LT(weightSum, 1e80);
        return false;
    }